

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O2

Min_Cube_t *
Abc_NodeCovProduct(Cov_Man_t *p,Min_Cube_t *pCover0,Min_Cube_t *pCover1,int fEsop,int nSupp)

{
  int iVar1;
  Min_Man_t *p_00;
  int iVar2;
  Min_Cube_t *pCube;
  Min_Cube_t *pMVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  if ((pCover0 == (Min_Cube_t *)0x0) || (pCover1 == (Min_Cube_t *)0x0)) {
    __assert_fail("pCover0 && pCover1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covCore.c"
                  ,0x1da,
                  "Min_Cube_t *Abc_NodeCovProduct(Cov_Man_t *, Min_Cube_t *, Min_Cube_t *, int, int)"
                 );
  }
  Min_ManClean(p->pManMin,nSupp);
  uVar5 = 0;
  if (0 < nSupp) {
    uVar5 = (ulong)(uint)nSupp;
  }
  do {
    pMVar3 = pCover1;
    if (pCover0 == (Min_Cube_t *)0x0) {
      if (fEsop == 0) {
        Min_SopMinimize(p->pManMin);
      }
      else {
        Min_EsopMinimize(p->pManMin);
      }
      pMVar3 = Min_CoverCollect(p->pManMin,nSupp);
      iVar2 = Min_CoverCountCubes(pMVar3);
      if (p->nFaninMax < iVar2) {
LAB_003a3029:
        Min_CoverRecycle(p->pManMin,pMVar3);
        pMVar3 = (Min_Cube_t *)0x0;
      }
      return pMVar3;
    }
    for (; pMVar3 != (Min_Cube_t *)0x0; pMVar3 = pMVar3->pNext) {
      uVar4 = p->vPairs0->nSize;
      uVar8 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar8 = 0;
      }
      uVar7 = 0;
      while (uVar8 != uVar7) {
        iVar2 = p->vPairs0->pArray[uVar7];
        iVar1 = p->vPairs1->pArray[uVar7];
        uVar7 = uVar7 + 1;
        if ((pMVar3->uData[iVar1 >> 4] >> ((char)iVar1 * '\x02' & 0x1fU) &
             pCover0->uData[iVar2 >> 4] >> ((char)iVar2 * '\x02' & 0x1fU) & 3) == 0)
        goto LAB_003a300c;
      }
      p_00 = p->pManMin;
      if (p->nCubesMax < p_00->nCubes) {
        pMVar3 = Min_CoverCollect(p_00,nSupp);
        goto LAB_003a3029;
      }
      pCube = Min_CubeAlloc(p_00);
      uVar4 = *(uint *)&pCube->field_0x8 & 0x3fffff;
      *(uint *)&pCube->field_0x8 = uVar4;
      bVar6 = 0;
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        iVar2 = p->vComTo0->pArray[uVar8];
        uVar10 = 3;
        uVar9 = uVar10;
        if (iVar2 != -1) {
          uVar9 = pCover0->uData[iVar2 >> 4] >> ((char)iVar2 * '\x02' & 0x1fU) & 3;
        }
        iVar2 = p->vComTo1->pArray[uVar8];
        if (iVar2 != -1) {
          uVar10 = pMVar3->uData[iVar2 >> 4] >> ((char)iVar2 * '\x02' & 0x1fU);
        }
        if ((uVar10 & uVar9) != 3) {
          pCube->uData[uVar8 >> 4 & 0xfffffff] =
               pCube->uData[uVar8 >> 4 & 0xfffffff] ^ (uVar10 & uVar9 ^ 3) << (bVar6 & 0x1e);
          uVar4 = uVar4 + 0x400000;
          *(uint *)&pCube->field_0x8 = uVar4;
        }
        bVar6 = bVar6 + 2;
      }
      if (fEsop == 0) {
        Min_SopAddCube(p->pManMin,pCube);
      }
      else {
        Min_EsopAddCube(p->pManMin,pCube);
      }
LAB_003a300c:
    }
    pCover0 = pCover0->pNext;
  } while( true );
}

Assistant:

Min_Cube_t * Abc_NodeCovProduct( Cov_Man_t * p, Min_Cube_t * pCover0, Min_Cube_t * pCover1, int fEsop, int nSupp )
{
    Min_Cube_t * pCube, * pCube0, * pCube1;
    Min_Cube_t * pCover;
    int i, Val0, Val1;
    assert( pCover0 && pCover1 );

    // clean storage
    Min_ManClean( p->pManMin, nSupp );
    // go through the cube pairs
    Min_CoverForEachCube( pCover0, pCube0 )
    Min_CoverForEachCube( pCover1, pCube1 )
    {
        // go through the support variables of the cubes
        for ( i = 0; i < p->vPairs0->nSize; i++ )
        {
            Val0 = Min_CubeGetVar( pCube0, p->vPairs0->pArray[i] );
            Val1 = Min_CubeGetVar( pCube1, p->vPairs1->pArray[i] );
            if ( (Val0 & Val1) == 0 )
                break;
        }
        // check disjointness
        if ( i < p->vPairs0->nSize )
            continue;

        if ( p->pManMin->nCubes > p->nCubesMax )
        {
            pCover = Min_CoverCollect( p->pManMin, nSupp );
//Min_CoverWriteFile( pCover, "large", 1 );
            Min_CoverRecycle( p->pManMin, pCover );
            return NULL;
        }

        // create the product cube
        pCube = Min_CubeAlloc( p->pManMin );

        // add the literals
        pCube->nLits = 0;
        for ( i = 0; i < nSupp; i++ )
        {
            if ( p->vComTo0->pArray[i] == -1 )
                Val0 = 3;
            else
                Val0 = Min_CubeGetVar( pCube0, p->vComTo0->pArray[i] );

            if ( p->vComTo1->pArray[i] == -1 )
                Val1 = 3;
            else
                Val1 = Min_CubeGetVar( pCube1, p->vComTo1->pArray[i] );

            if ( (Val0 & Val1) == 3 )
                continue;

            Min_CubeXorVar( pCube, i, (Val0 & Val1) ^ 3 );
            pCube->nLits++;
        }
        // add the cube to storage
        if ( fEsop ) 
            Min_EsopAddCube( p->pManMin, pCube );
        else
            Min_SopAddCube( p->pManMin, pCube );
    }

    // minimize the cover
    if ( fEsop ) 
        Min_EsopMinimize( p->pManMin );
    else
        Min_SopMinimize( p->pManMin );
    pCover = Min_CoverCollect( p->pManMin, nSupp );

    // quit if the cover is too large
    if ( Min_CoverCountCubes(pCover) > p->nFaninMax )
    {
/*        
Min_CoverWriteFile( pCover, "large", 1 );
        Min_CoverExpand( p->pManMin, pCover );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        Min_EsopMinimize( p->pManMin );
        pCover = Min_CoverCollect( p->pManMin, nSupp );
*/
        Min_CoverRecycle( p->pManMin, pCover );
        return NULL;
    }
    return pCover;
}